

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O0

void __thiscall Connection::Connection(Connection *this)

{
  SSL_METHOD *pSVar1;
  SSL_CTX *pSVar2;
  SSL *pSVar3;
  Connection *this_local;
  
  this->eof = false;
  this->method = (SSL_METHOD *)0x0;
  this->ctx = (SSL_CTX *)0x0;
  this->handle = (SSL *)0x0;
  this->fd = -1;
  pSVar1 = ssl::TLS_client_method();
  this->method = pSVar1;
  pSVar2 = ssl::SSL_CTX_new((SSL_METHOD *)this->method);
  this->ctx = pSVar2;
  if (this->ctx != (SSL_CTX *)0x0) {
    ssl::SSL_CTX_set_verify((SSL_CTX *)this->ctx,0,verify_callback);
    pSVar3 = ssl::SSL_new((SSL_CTX *)this->ctx);
    this->handle = pSVar3;
    return;
  }
  __assert_fail("ctx != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sandsmark[P]sponsoryeet/connection.h"
                ,0x21,"Connection::Connection()");
}

Assistant:

Connection()
    {
        method = ssl::TLS_client_method();
        ctx = ssl::SSL_CTX_new(method);
        assert(ctx != nullptr);
        ssl::SSL_CTX_set_verify(ctx, ssl::SSL_VERIFY_NONE, verify_callback);
        handle = ssl::SSL_new(ctx);
    }